

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ch.cpp
# Opt level: O0

HRESULT GetSerializedBuffer(LPCSTR fileContents,JsFinalizeCallback fileContentFinalizeCallback,
                           JsValueRef *byteCodeBuffer)

{
  JsErrorCode JVar1;
  size_t sVar2;
  PAL_FILE *pPVar3;
  LPCWSTR pWVar4;
  JsErrorCode jsErrorCode_1;
  JsErrorCode jsErrorCode;
  JsValueRef scriptSource;
  JsValueRef *ppvStack_20;
  HRESULT hr;
  JsValueRef *byteCodeBuffer_local;
  JsFinalizeCallback fileContentFinalizeCallback_local;
  LPCSTR fileContents_local;
  
  scriptSource._4_4_ = 0;
  ppvStack_20 = byteCodeBuffer;
  byteCodeBuffer_local = (JsValueRef *)fileContentFinalizeCallback;
  fileContentFinalizeCallback_local = (JsFinalizeCallback)fileContents;
  sVar2 = strlen(fileContents);
  JVar1 = ChakraRTInterface::JsCreateExternalArrayBuffer
                    (fileContents,(uint)sVar2,(JsFinalizeCallback)byteCodeBuffer_local,
                     fileContentFinalizeCallback_local,(JsValueRef *)&jsErrorCode_1);
  if (JVar1 == JsNoError) {
    JVar1 = ChakraRTInterface::JsSerialize(_jsErrorCode_1,ppvStack_20,JsParseScriptAttributeNone);
    if (JVar1 != JsNoError) {
      pPVar3 = PAL_get_stderr(0);
      pWVar4 = Helpers::JsErrorCodeToString(JVar1);
      PAL_fwprintf(pPVar3,
                   L"ERROR: ChakraRTInterface::JsSerialize(scriptSource, byteCodeBuffer, JsParseScriptAttributeNone) failed. JsErrorCode=0x%x (%s)\n"
                   ,(ulong)JVar1,pWVar4);
      pPVar3 = PAL_get_stderr(0);
      PAL_fflush(pPVar3);
    }
  }
  else {
    pPVar3 = PAL_get_stderr(0);
    pWVar4 = Helpers::JsErrorCodeToString(JVar1);
    PAL_fwprintf(pPVar3,
                 L"ERROR: ChakraRTInterface::JsCreateExternalArrayBuffer((void*)fileContents, (unsigned int)strlen(fileContents), fileContentFinalizeCallback, (void*)fileContents, &scriptSource) failed. JsErrorCode=0x%x (%s)\n"
                 ,(ulong)JVar1,pWVar4);
    pPVar3 = PAL_get_stderr(0);
    PAL_fflush(pPVar3);
  }
  return scriptSource._4_4_;
}

Assistant:

HRESULT GetSerializedBuffer(LPCSTR fileContents, JsFinalizeCallback fileContentFinalizeCallback, JsValueRef *byteCodeBuffer)
{
    HRESULT hr = S_OK;

    JsValueRef scriptSource;
    IfJsErrorFailLog(ChakraRTInterface::JsCreateExternalArrayBuffer((void*)fileContents,
        (unsigned int)strlen(fileContents), fileContentFinalizeCallback, (void*)fileContents, &scriptSource));
    IfJsErrorFailLog(ChakraRTInterface::JsSerialize(scriptSource, byteCodeBuffer,
        JsParseScriptAttributeNone));

Error:
    return hr;
}